

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

JavascriptPromiseCapability *
Js::JavascriptPromise::CreatePromiseCapabilityRecord
          (RecyclableObject *constructor,ScriptContext *scriptContext)

{
  bool bVar1;
  CallFlags flags;
  JavascriptLibrary *this;
  RecyclableObject *promise_00;
  JavascriptPromiseCapability *capability;
  Var pvVar2;
  Arguments local_88;
  Var local_78;
  Var promise;
  undefined1 local_68 [8];
  Arguments args;
  Var argVars [2];
  CallInfo local_40;
  CallInfo callinfo;
  JavascriptPromiseCapabilitiesExecutorFunction *executor;
  JavascriptPromiseCapability *promiseCapability;
  Var undefinedVar;
  JavascriptLibrary *library;
  ScriptContext *scriptContext_local;
  RecyclableObject *constructor_local;
  
  this = ScriptContext::GetLibrary(scriptContext);
  promise_00 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  capability = JavascriptPromiseCapability::New(promise_00,promise_00,promise_00,scriptContext);
  callinfo = (CallInfo)
             JavascriptLibrary::CreatePromiseCapabilitiesExecutorFunction
                       (this,EntryCapabilitiesExecutorFunction,capability);
  flags = operator|(CallFlags_Value,CallFlags_New);
  CallInfo::CallInfo(&local_40,flags,2);
  promise = (Var)local_40;
  args.Values = (Type)constructor;
  Arguments::Arguments((Arguments *)local_68,local_40,&args.Values);
  Arguments::Arguments(&local_88,(Arguments *)local_68);
  local_78 = JavascriptFunction::CallAsConstructor
                       (constructor,(Var)0x0,&local_88,scriptContext,(AuxArray<unsigned_int> *)0x0);
  pvVar2 = JavascriptPromiseCapability::GetResolve(capability);
  bVar1 = JavascriptConversion::IsCallable(pvVar2);
  if (bVar1) {
    pvVar2 = JavascriptPromiseCapability::GetReject(capability);
    bVar1 = JavascriptConversion::IsCallable(pvVar2);
    if (bVar1) {
      JavascriptPromiseCapability::SetPromise(capability,local_78);
      return capability;
    }
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,L"Promise");
}

Assistant:

JavascriptPromiseCapability* JavascriptPromise::CreatePromiseCapabilityRecord(RecyclableObject* constructor, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        Var undefinedVar = library->GetUndefined();
        JavascriptPromiseCapability* promiseCapability = JavascriptPromiseCapability::New(undefinedVar, undefinedVar, undefinedVar, scriptContext);

        JavascriptPromiseCapabilitiesExecutorFunction* executor = library->CreatePromiseCapabilitiesExecutorFunction(EntryCapabilitiesExecutorFunction, promiseCapability);

        CallInfo callinfo = Js::CallInfo((Js::CallFlags)(Js::CallFlags::CallFlags_Value | Js::CallFlags::CallFlags_New), 2);
        Var argVars[] = { constructor, executor };
        Arguments args(callinfo, argVars);
        Var promise = JavascriptFunction::CallAsConstructor(constructor, nullptr, args, scriptContext);

        if (!JavascriptConversion::IsCallable(promiseCapability->GetResolve()) || !JavascriptConversion::IsCallable(promiseCapability->GetReject()))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("Promise"));
        }

        promiseCapability->SetPromise(promise);

        return promiseCapability;
    }